

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.h
# Opt level: O2

CFL_ALLOWED_TYPE is_cfl_allowed(MACROBLOCKD *xd)

{
  ulong uVar1;
  
  uVar1 = (ulong)(*xd->mi)->bsize;
  if (xd->lossless[*(ushort *)&(*xd->mi)->field_0xa7 & 7] != 0) {
    return av1_ss_size_lookup[uVar1][xd->plane[1].subsampling_x][xd->plane[1].subsampling_y] ==
           BLOCK_4X4;
  }
  return (0x1f07ffUL >> (uVar1 & 0x3f) & 1) != 0 && (0x2f0bffUL >> (uVar1 & 0x3f) & 1) != 0;
}

Assistant:

static inline CFL_ALLOWED_TYPE is_cfl_allowed(const MACROBLOCKD *xd) {
  const MB_MODE_INFO *mbmi = xd->mi[0];
  const BLOCK_SIZE bsize = mbmi->bsize;
  assert(bsize < BLOCK_SIZES_ALL);
  if (xd->lossless[mbmi->segment_id]) {
    // In lossless, CfL is available when the partition size is equal to the
    // transform size.
    const int ssx = xd->plane[AOM_PLANE_U].subsampling_x;
    const int ssy = xd->plane[AOM_PLANE_U].subsampling_y;
    const int plane_bsize = get_plane_block_size(bsize, ssx, ssy);
    return (CFL_ALLOWED_TYPE)(plane_bsize == BLOCK_4X4);
  }
  // Spec: CfL is available to luma partitions lesser than or equal to 32x32
  return (CFL_ALLOWED_TYPE)(block_size_wide[bsize] <= 32 &&
                            block_size_high[bsize] <= 32);
}